

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<unsigned_int,_true>::push_back
          (SmallVectorTemplateBase<unsigned_int,_true> *this,uint *Elt)

{
  size_t sVar1;
  size_t sVar2;
  iterator puVar3;
  uint *Elt_local;
  SmallVectorTemplateBase<unsigned_int,_true> *this_local;
  
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar2 <= sVar1) {
    grow(this,0);
  }
  puVar3 = SmallVectorTemplateCommon<unsigned_int,_void>::end
                     (&this->super_SmallVectorTemplateCommon<unsigned_int,_void>);
  *puVar3 = *Elt;
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar1 + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }